

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::IfcBeamType(IfcBeamType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00806a70;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcBeamType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__008b3838);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8b3708;
  *(undefined8 *)&this->field_0x1c0 = 0x8b3820;
  *(undefined8 *)&this->field_0x88 = 0x8b3730;
  *(undefined8 *)&this->field_0x98 = 0x8b3758;
  *(undefined8 *)&this->field_0xf0 = 0x8b3780;
  *(undefined8 *)&this->field_0x148 = 0x8b37a8;
  *(undefined8 *)&this->field_0x180 = 0x8b37d0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8b37f8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}